

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O1

void __thiscall
lemon::
VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>::
VectorMap(VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
          *this,GraphType *graph)

{
  Container *pCVar1;
  
  (this->super_ObserverBase)._notifier = (Notifier *)0x0;
  (this->super_ObserverBase)._index._M_node = (_List_node_base *)0x0;
  (this->super_ObserverBase)._vptr_ObserverBase = (_func_int **)&PTR__VectorMap_0016f550;
  (this->container).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->container).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->container).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->container).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->container).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  ::attach(&graph->node_notifier,&this->super_ObserverBase);
  pCVar1 = ((this->super_ObserverBase)._notifier)->container;
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->container,
             (long)(int)((ulong)((long)(pCVar1->super_SmartDigraphBase)._nodes.
                                       super__Vector_base<lemon::SmartDigraphBase::NodeT,_std::allocator<lemon::SmartDigraphBase::NodeT>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pCVar1->super_SmartDigraphBase)._nodes.
                                      super__Vector_base<lemon::SmartDigraphBase::NodeT,_std::allocator<lemon::SmartDigraphBase::NodeT>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3),false);
  return;
}

Assistant:

VectorMap(const GraphType& graph) {
    Parent::attach(graph.notifier(Item()));
    container.resize(Parent::notifier()->maxId() + 1);
  }